

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegularExpression.cpp
# Opt level: O0

int __thiscall
xercesc_4_0::RegularExpression::matchUnion
          (RegularExpression *this,Context *context,Op *op,XMLSize_t offset)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  int ret;
  undefined1 local_f0 [8];
  Context tmpContext;
  XMLSize_t i;
  undefined1 local_88 [4];
  int bestResult;
  Context bestResultContext;
  XMLSize_t opSize;
  XMLSize_t offset_local;
  Op *op_local;
  Context *context_local;
  RegularExpression *this_local;
  
  iVar2 = (*op->_vptr_Op[4])();
  bestResultContext.fMemoryManager = (MemoryManager *)CONCAT44(extraout_var,iVar2);
  Context::Context((Context *)local_88,XMLPlatformUtils::fgMemoryManager);
  i._4_4_ = -1;
  for (tmpContext.fMemoryManager = (MemoryManager *)0x0;
      tmpContext.fMemoryManager < bestResultContext.fMemoryManager;
      tmpContext.fMemoryManager =
           (MemoryManager *)((long)&(tmpContext.fMemoryManager)->_vptr_MemoryManager + 1)) {
    Context::Context((Context *)local_f0,context);
    iVar2 = (*op->_vptr_Op[5])(op,tmpContext.fMemoryManager);
    iVar2 = match(this,(Context *)local_f0,(Op *)CONCAT44(extraout_var_00,iVar2),offset);
    if ((((iVar2 < 0) || (context->fLimit < (ulong)(long)iVar2)) || (iVar2 <= i._4_4_)) ||
       (Context::operator=((Context *)local_88,(Context *)local_f0), i._4_4_ = iVar2,
       (long)iVar2 != context->fLimit)) {
      bVar1 = false;
    }
    else {
      bVar1 = true;
    }
    Context::~Context((Context *)local_f0);
    if (bVar1) break;
  }
  if (i._4_4_ != -1) {
    Context::operator=(context,(Context *)local_88);
  }
  Context::~Context((Context *)local_88);
  return i._4_4_;
}

Assistant:

int RegularExpression::matchUnion(Context* const context,
                                   const Op* const op, XMLSize_t offset) const
{
    XMLSize_t opSize = op->getSize();

    Context bestResultContext;
    int bestResult=-1;
    for(XMLSize_t i=0; i < opSize; i++) {
        Context tmpContext(context);
        int ret = match(&tmpContext, op->elementAt(i), offset);
        if (ret >= 0 && (XMLSize_t)ret <= context->fLimit && ret>bestResult)
        {
            bestResult=ret;
            bestResultContext=tmpContext;
            // exit early, if we reached the end of the string
            if((XMLSize_t)ret == context->fLimit)
                break;
        }
    }
    if(bestResult!=-1)
        *context=bestResultContext;
    return bestResult;
}